

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

MempoolAcceptResult * __thiscall
ChainstateManager::ProcessTransaction(ChainstateManager *this,CTransactionRef *tx,bool test_accept)

{
  byte bypass_limits;
  Chainstate *this_00;
  CTxMemPool *pCVar1;
  byte in_CL;
  int64_t in_RDX;
  CTransactionRef *in_RSI;
  Chainstate *in_RDI;
  long in_FS_OFFSET;
  Chainstate *active_chainstate;
  MempoolAcceptResult *result;
  TxValidationState state;
  int64_t in_stack_000002f0;
  CCoinsViewCache *in_stack_000002f8;
  CTxMemPool *in_stack_00000300;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  string *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined8 in_stack_fffffffffffffea0;
  TxValidationResult result_00;
  ValidationState<TxValidationResult> *in_stack_fffffffffffffea8;
  TxValidationState *in_stack_fffffffffffffeb8;
  allocator<char> *__a;
  Chainstate *this_01;
  undefined1 in_stack_ffffffffffffff06;
  Chainstate *active_chainstate_00;
  allocator<char> local_da;
  allocator<char> local_d9 [209];
  long local_8;
  
  result_00 = (TxValidationResult)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bypass_limits = in_CL & 1;
  this_01 = in_RDI;
  active_chainstate_00 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
             (AnnotatedMixin<std::recursive_mutex> *)0x7e5815);
  this_00 = ActiveChainstate((ChainstateManager *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  pCVar1 = Chainstate::GetMempool
                     ((Chainstate *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (pCVar1 == (CTxMemPool *)0x0) {
    TxValidationState::TxValidationState
              ((TxValidationState *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    __a = local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               (char *)in_RDI,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               (char *)in_RDI,__a);
    ValidationState<TxValidationResult>::Invalid
              (in_stack_fffffffffffffea8,result_00,
               (string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe90);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::allocator<char>::~allocator(&local_da);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::allocator<char>::~allocator(local_d9);
    TxValidationState::TxValidationState
              ((TxValidationState *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (TxValidationState *)0x7e590c);
    MempoolAcceptResult::Failure(in_stack_fffffffffffffeb8);
    TxValidationState::~TxValidationState
              ((TxValidationState *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    TxValidationState::~TxValidationState
              ((TxValidationState *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  else {
    GetTime();
    AcceptToMemoryPool(active_chainstate_00,in_RSI,in_RDX,(bool)bypass_limits,
                       (bool)in_stack_ffffffffffffff06);
    Chainstate::GetMempool
              ((Chainstate *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    Chainstate::CoinsTip(this_00);
    CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    CTxMemPool::check(in_stack_00000300,in_stack_000002f8,in_stack_000002f0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (MempoolAcceptResult *)this_01;
}

Assistant:

MempoolAcceptResult ChainstateManager::ProcessTransaction(const CTransactionRef& tx, bool test_accept)
{
    AssertLockHeld(cs_main);
    Chainstate& active_chainstate = ActiveChainstate();
    if (!active_chainstate.GetMempool()) {
        TxValidationState state;
        state.Invalid(TxValidationResult::TX_NO_MEMPOOL, "no-mempool");
        return MempoolAcceptResult::Failure(state);
    }
    auto result = AcceptToMemoryPool(active_chainstate, tx, GetTime(), /*bypass_limits=*/ false, test_accept);
    active_chainstate.GetMempool()->check(active_chainstate.CoinsTip(), active_chainstate.m_chain.Height() + 1);
    return result;
}